

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O1

int prvTidytmbvsnprintf(tmbstr buffer,size_t count,ctmbstr format,__va_list_tag *args)

{
  int iVar1;
  
  iVar1 = vsnprintf(buffer,count - 1,format,args);
  buffer[count - 1] = '\0';
  return iVar1;
}

Assistant:

int TY_(tmbvsnprintf)(tmbstr buffer, size_t count, ctmbstr format, va_list args)
{
    int retval;

#if HAS_VSNPRINTF
    retval = vsnprintf(buffer, count - 1, format, args);
    /* todo: conditionally null-terminate the string? */
    buffer[count - 1] = 0;
#else
    retval = vsprintf(buffer, format, args);
#endif /* HAS_VSNPRINTF */
    return retval;
}